

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t Val;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  uint imm;
  uint pred;
  uint Rd;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  pred = 3;
  _Rd = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0xc,4);
  Val = fieldFromInstruction_4(Address_local._4_4_,0x1c,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,0xc);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar4 = MCInst_getOpcode(pMStack_18);
  if (uVar4 == 0xd8) {
    DVar5 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rd);
    _Var1 = Check(&pred,DVar5);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar5 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rd);
  _Var1 = Check(&pred,DVar5);
  if (_Var1) {
    MCOperand_CreateImm0(pMStack_18,(ulong)(uVar3 << 0xc | uVar2));
    DVar5 = DecodePredicateOperand(pMStack_18,Val,(uint64_t)Decoder_local,_Rd);
    _Var1 = Check(&pred,DVar5);
    if (_Var1) {
      Inst_local._4_4_ = pred;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 12) << 0);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);

	if (MCInst_getOpcode(Inst) == ARM_MOVTi16)
		if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}